

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O2

time_point __thiscall jaegertracing::Span::startTimeSystem(Span *this)

{
  duration dVar1;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x148))->__data);
  dVar1.__r = *(rep *)(this + 0xe8);
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x148));
  return (time_point)(duration)dVar1.__r;
}

Assistant:

SystemClock::time_point startTimeSystem() const
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return _startTimeSystem;
    }